

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O3

int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cube_t *pMVar1;
  bool bVar2;
  int iVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  Mvc_Cube_t *pMVar6;
  uint uVar7;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcOpAlg.c"
                  ,0x8d,"int Mvc_CoverAlgebraicEqual(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pMVar4 = (pCover1->lCubes).pHead;
  iVar3 = 1;
  if (pMVar4 != (Mvc_Cube_t *)0x0) {
    pMVar1 = (pCover2->lCubes).pHead;
    if (pMVar1 != (Mvc_Cube_t *)0x0) {
LAB_004241bf:
      uVar5 = *(uint *)&pMVar4->field_0x8 & 0xffffff;
      pMVar6 = pMVar1;
      do {
        if (uVar5 == 0) {
          if (pMVar4->pData[0] == pMVar6->pData[0]) goto LAB_0042421a;
        }
        else {
          uVar7 = uVar5;
          if (uVar5 == 1) {
            if ((pMVar4->pData[0] == pMVar6->pData[0]) &&
               (*(int *)&pMVar4->field_0x14 == *(int *)&pMVar6->field_0x14)) goto LAB_0042421a;
          }
          else {
            while (pMVar4->pData[uVar7] == pMVar6->pData[uVar7]) {
              bVar2 = (int)uVar7 < 1;
              uVar7 = uVar7 - 1;
              if (bVar2) goto LAB_0042421a;
            }
          }
        }
        pMVar6 = pMVar6->pNext;
        if (pMVar6 == (Mvc_Cube_t *)0x0) break;
      } while( true );
    }
    iVar3 = 0;
  }
  return iVar3;
LAB_0042421a:
  pMVar4 = pMVar4->pNext;
  if (pMVar4 == (Mvc_Cube_t *)0x0) {
    return 1;
  }
  goto LAB_004241bf;
}

Assistant:

int Mvc_CoverAlgebraicEqual( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cube_t * pCube1, * pCube2;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
            return 0;
    }
    return 1;
}